

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

bool __thiscall Hospital::validate_String_Must_Be_Number(Hospital *this,string *id)

{
  char *pcVar1;
  int i;
  ulong uVar2;
  
  uVar2 = 0;
  while (((id->_M_string_length != uVar2 &&
          (pcVar1 = (id->_M_dataplus)._M_p, (byte)(pcVar1[uVar2] - 0x30U) < 10)) && (*pcVar1 != '0')
         )) {
    uVar2 = uVar2 + 1;
  }
  return id->_M_string_length <= uVar2;
}

Assistant:

bool Hospital:: validate_String_Must_Be_Number(string id){
    int countr = 0;
    for (int i = 0; i <id.length() ; ++i) {
        if(id[i]>=48 && id[i]<=57 && id[0]!='0')countr ++;
        else {
            return false;
        }
    }
    if(countr == id.length())return true ;
}